

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# padringdb.h
# Opt level: O3

void __thiscall PadringDB::onArea(PadringDB *this,double x,double y)

{
  this->m_dieWidth = x;
  this->m_dieHeight = y;
  (this->m_north).m_dieSize = x;
  (this->m_south).m_dieSize = x;
  (this->m_east).m_dieSize = y;
  (this->m_west).m_dieSize = y;
  Layout::setEdgePos(&this->m_north,y);
  Layout::setEdgePos(&this->m_east,x);
  return;
}

Assistant:

virtual void onArea(double x, double y) override
    {
        m_dieWidth  = x;
        m_dieHeight = y;
        
        m_north.setDieSize(x);
        m_south.setDieSize(x);
        m_east.setDieSize(y);
        m_west.setDieSize(y);

        m_north.setEdgePos(y);
        m_east.setEdgePos(x);        
    }